

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O3

bool __thiscall ON_Brep::IsValidFace(ON_Brep *this,int face_index,ON_TextLog *text_log)

{
  ON_BrepFace *this_00;
  uint loop_index;
  ON_BrepFace *pOVar1;
  int *piVar2;
  ON_BrepLoop *pOVar3;
  ON_Surface *pOVar4;
  bool bVar5;
  ulong uVar6;
  ON_Surface *pOVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar8 = (ulong)(uint)face_index;
  if (face_index < 0 ||
      (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_count <=
      face_index) {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,"brep face_index = %d (should be >=0 and <%d=brep.m_F.Count()).\n",
                        uVar8);
    }
    goto LAB_003ec8c3;
  }
  pOVar1 = (this->m_F).super_ON_ObjectArray<ON_BrepFace>.super_ON_ClassArray<ON_BrepFace>.m_a;
  this_00 = pOVar1 + uVar8;
  if (pOVar1[uVar8].m_face_index == face_index) {
    if (this_00->m_brep == this) {
      uVar6 = (ulong)(this_00->m_li).m_count;
      if (0 < (long)uVar6) {
        uVar12 = 0;
        do {
          piVar2 = (this_00->m_li).m_a;
          loop_index = piVar2[uVar12];
          uVar11 = (ulong)(int)loop_index;
          if (uVar12 != 0) {
            uVar10 = 0;
            do {
              if (piVar2[uVar10] == loop_index) {
                if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
                ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
                ON_TextLog::PushIndent(text_log);
                ON_TextLog::Print(text_log,
                                  "face.m_li[%d]=face.m_li[%d]=%d (a loop index should appear once in face.m_li[])\n"
                                  ,uVar12 & 0xffffffff,uVar10 & 0xffffffff,(ulong)loop_index);
                goto LAB_003ec8bb;
              }
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          bVar5 = IsValidLoop(this,loop_index,text_log);
          if (!bVar5) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
            ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
            ON_TextLog::PushIndent(text_log);
            pcVar9 = "brep.m_L[face.m_li[%d]=%d] is not valid.\n";
LAB_003ecb36:
            uVar12 = uVar12 & 0xffffffff;
            uVar8 = (ulong)loop_index;
            goto LAB_003ec8b4;
          }
          pOVar3 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                   m_a;
          if (pOVar3[uVar11].m_loop_index != loop_index) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
              ON_TextLog::PushIndent(text_log);
              pcVar9 = "face.m_li[%d]=%d is a deleted loop\n";
              goto LAB_003ecb36;
            }
            goto LAB_003ec8c3;
          }
          if (pOVar3[uVar11].m_fi != face_index) {
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
            ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
            ON_TextLog::PushIndent(text_log);
            ON_TextLog::Print(text_log,
                              "face.m_li[%d]=%d but brep.m_L[%d].m_fi=%d (m_fi should be %d)\n",
                              uVar12 & 0xffffffff,(ulong)loop_index,(ulong)loop_index,
                              (ulong)(uint)pOVar3[uVar11].m_fi,face_index);
            goto LAB_003ec8bb;
          }
          if (uVar12 == 0) {
            if (pOVar3[uVar11].m_type != outer) {
              if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
              ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
              ON_TextLog::PushIndent(text_log);
              pcVar9 = "brep.m_L[face.m_li[0]=%d].m_type is not outer.\n";
              goto LAB_003ecbab;
            }
          }
          else if ((pOVar3[uVar11].m_type & ~outer) != inner) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
              ON_TextLog::PushIndent(text_log);
              pcVar9 = "brep.m_L[face.m_li[%d]=%d].m_type is not inner or slit.\n";
              goto LAB_003ecb36;
            }
            goto LAB_003ec8c3;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 != uVar6);
        uVar11 = (ulong)this_00->m_si;
        if (((long)uVar11 < 0) ||
           ((this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count <= this_00->m_si)) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
          ON_TextLog::PushIndent(text_log);
          uVar12 = (ulong)(uint)this_00->m_si;
          uVar8 = (ulong)(uint)(this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_count;
          pcVar9 = "face.m_si=%d (should be >=0 and <%d=m_S.Count())\n";
          goto LAB_003ec8b4;
        }
        pOVar4 = (this->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[uVar11];
        if (pOVar4 == (ON_Surface *)0x0) {
          if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
          ON_TextLog::PushIndent(text_log);
          uVar11 = (ulong)(uint)this_00->m_si;
          pcVar9 = "brep.m_S[face.m_si=%d] is nullptr\n";
        }
        else {
          pOVar7 = ON_SurfaceProxy::ProxySurface(&this_00->super_ON_SurfaceProxy);
          if (pOVar4 == pOVar7) {
            bVar5 = ON_SurfaceProxy::ProxySurfaceIsTransposed(&this_00->super_ON_SurfaceProxy);
            if (!bVar5) {
              return true;
            }
            if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
            ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
            ON_TextLog::PushIndent(text_log);
            pcVar9 = "face.ProxySurfaceIsTransposed() is true.\n";
            goto LAB_003ec85d;
          }
          if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
          ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
          ON_TextLog::PushIndent(text_log);
          pcVar9 = "brep.m_S[face.m_si=%d] != face.ProxySurface().\n";
LAB_003ecbab:
          uVar11 = uVar11 & 0xffffffff;
        }
        ON_TextLog::Print(text_log,pcVar9,uVar11);
        goto LAB_003ec8bb;
      }
      if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
      ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
      ON_TextLog::PushIndent(text_log);
      pcVar9 = "face.m_li.Count() <= 0 (should be >= 1)\n";
    }
    else {
      if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
      ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
      ON_TextLog::PushIndent(text_log);
      pcVar9 = "face.m_brep does not point to parent brep.\n";
    }
LAB_003ec85d:
    ON_TextLog::Print(text_log,pcVar9);
  }
  else {
    if (text_log == (ON_TextLog *)0x0) goto LAB_003ec8c3;
    ON_TextLog::Print(text_log,"brep.m_F[%d] face is not valid.\n",uVar8);
    ON_TextLog::PushIndent(text_log);
    uVar12 = (ulong)(uint)this_00->m_face_index;
    pcVar9 = "face.m_face_index = %d (should be %d).\n";
LAB_003ec8b4:
    ON_TextLog::Print(text_log,pcVar9,uVar12,uVar8);
  }
LAB_003ec8bb:
  ON_TextLog::PopIndent(text_log);
LAB_003ec8c3:
  bVar5 = ON_IsNotValid();
  return bVar5;
}

Assistant:

bool
ON_Brep::IsValidFace( int face_index, ON_TextLog* text_log  ) const
{
  if ( face_index < 0 || face_index >= m_F.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep face_index = %d (should be >=0 and <%d=brep.m_F.Count()).\n",
                      face_index, m_F.Count());
    }
    return ON_BrepIsNotValid();
  }
  const ON_BrepFace& face = m_F[face_index];
  if ( face.m_face_index != face_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_face_index = %d (should be %d).\n",
                       face.m_face_index, face_index );
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }
  if ( face.m_brep != this )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_brep does not point to parent brep.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  const int face_loop_count = face.m_li.Count();
  if ( face_loop_count <= 0 )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_li.Count() <= 0 (should be >= 1)\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  int i, fli, li;
  for ( fli = 0; fli < face_loop_count; fli++ ) 
  {
    li = face.m_li[fli];
    for ( i = 0; i < fli; i++ ) 
    {
      if ( face.m_li[i] == li )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("face.m_li[%d]=face.m_li[%d]=%d (a loop index should appear once in face.m_li[])\n",
                          fli,i,li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    if ( !IsValidLoop( li, text_log ) )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("brep.m_L[face.m_li[%d]=%d] is not valid.\n",fli,li);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    const ON_BrepLoop& loop = m_L[li];
    if ( loop.m_loop_index != li )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("face.m_li[%d]=%d is a deleted loop\n",
                        fli,li);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( loop.m_fi != face_index )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
        text_log->PushIndent();
        text_log->Print("face.m_li[%d]=%d but brep.m_L[%d].m_fi=%d (m_fi should be %d)\n",
                        fli,li,li,loop.m_fi,face_index);
        text_log->PopIndent();
      }
      return ON_BrepIsNotValid();
    }
    if ( fli == 0 ) 
    {
      if ( loop.m_type != ON_BrepLoop::outer )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("brep.m_L[face.m_li[0]=%d].m_type is not outer.\n",li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
    else
    {
      if (   loop.m_type != ON_BrepLoop::slit 
           && loop.m_type != ON_BrepLoop::inner 
         )
      {
        if ( text_log )
        {
          text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
          text_log->PushIndent();
          text_log->Print("brep.m_L[face.m_li[%d]=%d].m_type is not inner or slit.\n",fli,li);
          text_log->PopIndent();
        }
        return ON_BrepIsNotValid();
      }
    }
  }

  const int si = face.m_si;
  if ( si < 0 || si >= m_S.Count() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.m_si=%d (should be >=0 and <%d=m_S.Count())\n",
                      face.m_si,m_S.Count());                      
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( !m_S[si] )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("brep.m_S[face.m_si=%d] is nullptr\n",face.m_si);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( m_S[si] != face.ProxySurface() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("brep.m_S[face.m_si=%d] != face.ProxySurface().\n",si);
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  if ( face.ProxySurfaceIsTransposed() )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_F[%d] face is not valid.\n",face_index);
      text_log->PushIndent();
      text_log->Print("face.ProxySurfaceIsTransposed() is true.\n");
      text_log->PopIndent();
    }
    return ON_BrepIsNotValid();
  }

  return true; 
}